

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O2

int Min_CubeCountLits(Min_Cube_t *pCube)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  
  iVar1 = 0;
  for (uVar2 = 0; uVar2 != (*(uint *)&pCube->field_0x8 >> 10 & 0xfff); uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar3 < 0x20; uVar3 = uVar3 + 2) {
      iVar1 = iVar1 + (uint)(((pCube->uData[uVar2] >> 1 ^ pCube->uData[uVar2]) >> (uVar3 & 0x1f) & 1
                             ) != 0);
    }
  }
  return iVar1;
}

Assistant:

static inline int Min_CubeCountLits( Min_Cube_t * pCube )
{
    unsigned uData;
    int Count = 0, i, w;
    for ( w = 0; w < (int)pCube->nWords; w++ )
    {
        uData = pCube->uData[w] ^ (pCube->uData[w] >> 1);
        for ( i = 0; i < 32; i += 2 )
            if ( uData & (1 << i) )
                Count++;
    }
    return Count;
}